

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O0

void __thiscall
chrono::ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed>::LoadIntLoadResidual_F
          (ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> *this,ChVectorDynamic<> *R,double c)

{
  Scalar SVar1;
  undefined4 uVar2;
  element_type *peVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  element_type *peVar7;
  Scalar *pSVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 local_88 [28];
  uint row;
  int local_5c;
  undefined1 local_58 [4];
  uint moffset;
  undefined1 local_38 [24];
  int i;
  uint rowQ;
  double c_local;
  ChVectorDynamic<> *R_local;
  ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> *this_local;
  
  local_38._20_4_ = 0;
  local_38._16_4_ = 0;
  _i = (element_type *)c;
  c_local = (double)R;
  R_local = (ChVectorDynamic<> *)this;
  while( true ) {
    uVar2 = local_38._16_4_;
    ChLoaderU::GetLoadable((ChLoaderU *)local_38);
    peVar7 = std::__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
    iVar5 = (**(code **)(*(long *)peVar7 + 0x40))();
    std::shared_ptr<chrono::ChLoadable>::~shared_ptr((shared_ptr<chrono::ChLoadable> *)local_38);
    if (iVar5 <= (int)uVar2) break;
    ChLoaderU::GetLoadable((ChLoaderU *)local_58);
    peVar7 = std::__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
    bVar4 = (**(code **)(*(long *)peVar7 + 0x58))(peVar7,local_38._16_4_);
    std::shared_ptr<chrono::ChLoadable>::~shared_ptr((shared_ptr<chrono::ChLoadable> *)local_58);
    if ((bVar4 & 1) != 0) {
      ChLoaderU::GetLoadable((ChLoaderU *)(local_88 + 0x18));
      peVar7 = std::
               __shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(local_88 + 0x18));
      iVar5 = (**(code **)(*(long *)peVar7 + 0x48))(peVar7,local_38._16_4_);
      std::shared_ptr<chrono::ChLoadable>::~shared_ptr
                ((shared_ptr<chrono::ChLoadable> *)(local_88 + 0x18));
      local_88._20_4_ = 0;
      local_5c = iVar5;
      while( true ) {
        uVar2 = local_88._20_4_;
        ChLoaderU::GetLoadable((ChLoaderU *)local_88);
        peVar7 = std::
                 __shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_88);
        uVar6 = (**(code **)(*(long *)peVar7 + 0x50))(peVar7,local_38._16_4_);
        std::shared_ptr<chrono::ChLoadable>::~shared_ptr((shared_ptr<chrono::ChLoadable> *)local_88)
        ;
        if (uVar6 <= (uint)uVar2) break;
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            &(this->loader).super_ChLoaderUdistributed.super_ChLoaderU.
                             super_ChLoader.Q,(ulong)(uint)local_38._20_4_);
        peVar3 = _i;
        SVar1 = *pSVar8;
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)c_local,
                            (ulong)(uint)(local_88._20_4_ + local_5c));
        auVar9._8_8_ = 0;
        auVar9._0_8_ = peVar3;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = SVar1;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *pSVar8;
        auVar9 = vfmadd213sd_fma(auVar9,auVar10,auVar11);
        *pSVar8 = auVar9._0_8_;
        local_38._20_4_ = local_38._20_4_ + 1;
        local_88._20_4_ = local_88._20_4_ + 1;
      }
    }
    local_38._16_4_ = local_38._16_4_ + 1;
  }
  return;
}

Assistant:

inline void ChLoad<Tloader>::LoadIntLoadResidual_F(ChVectorDynamic<>& R, double c) {
    unsigned int rowQ = 0;
    for (int i = 0; i < this->loader.GetLoadable()->GetSubBlocks(); ++i) {
        if (this->loader.GetLoadable()->IsSubBlockActive(i)) {
            unsigned int moffset = this->loader.GetLoadable()->GetSubBlockOffset(i);
            for (unsigned int row = 0; row < this->loader.GetLoadable()->GetSubBlockSize(i); ++row) {
                R(row + moffset) += this->loader.Q(rowQ) * c;
                ++rowQ;
            }
        }
    }
}